

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii85_fuzzer.cc
# Opt level: O0

void __thiscall FuzzHelper::doChecks(FuzzHelper *this)

{
  size_t in_RCX;
  undefined1 local_90 [8];
  Pl_ASCII85Decoder p;
  Pl_Discard discard;
  FuzzHelper *this_local;
  
  Pl_Discard::Pl_Discard((Pl_Discard *)&p.error);
  Pl_ASCII85Decoder::Pl_ASCII85Decoder((Pl_ASCII85Decoder *)local_90,"decode",(Pipeline *)&p.error);
  Pl_ASCII85Decoder::write((Pl_ASCII85Decoder *)local_90,(int)this->data,(void *)this->size,in_RCX);
  Pl_ASCII85Decoder::finish((Pl_ASCII85Decoder *)local_90);
  Pl_ASCII85Decoder::~Pl_ASCII85Decoder((Pl_ASCII85Decoder *)local_90);
  Pl_Discard::~Pl_Discard((Pl_Discard *)&p.error);
  return;
}

Assistant:

void
FuzzHelper::doChecks()
{
    Pl_Discard discard;
    Pl_ASCII85Decoder p("decode", &discard);
    p.write(const_cast<unsigned char*>(data), size);
    p.finish();
}